

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
::Iterator::Clone(Iterator *this)

{
  Iterator *this_00;
  Iterator *in_RDI;
  
  this_00 = (Iterator *)operator_new(0x20);
  Iterator(this_00,in_RDI);
  return &this_00->
          super_ParamIteratorInterface<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
  ;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }